

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

float __thiscall spvtools::opt::analysis::FloatConstant::GetFloatValue(FloatConstant *this)

{
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_reference pvVar4;
  float fVar5;
  FloatProxy<float> local_14;
  FloatConstant *pFStack_10;
  FloatProxy<float> a;
  FloatConstant *this_local;
  
  pFStack_10 = this;
  pTVar3 = Constant::type((Constant *)this);
  iVar1 = (*pTVar3->_vptr_Type[0xc])();
  uVar2 = Float::width((Float *)CONCAT44(extraout_var,iVar1));
  if (uVar2 != 0x20) {
    __assert_fail("type()->AsFloat()->width() == 32 && \"Not a 32-bit floating point value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                  ,0xf7,"float spvtools::opt::analysis::FloatConstant::GetFloatValue() const");
  }
  iVar1 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])();
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(extraout_var_00,iVar1),0);
  utils::FloatProxy<float>::FloatProxy(&local_14,*pvVar4);
  fVar5 = utils::FloatProxy<float>::getAsFloat(&local_14);
  return fVar5;
}

Assistant:

float GetFloatValue() const {
    assert(type()->AsFloat()->width() == 32 &&
           "Not a 32-bit floating point value.");
    utils::FloatProxy<float> a(words()[0]);
    return a.getAsFloat();
  }